

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::FunctionInliningCase::generateProgramData
          (ProgramData *__return_storage_ptr__,FunctionInliningCase *this,bool optimized)

{
  CaseShaderType CVar1;
  ProgramData *pPVar2;
  undefined2 *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  size_type *psVar7;
  long *plVar8;
  ulong *puVar9;
  undefined7 in_register_00000011;
  char cVar10;
  ulong uVar11;
  int iVar12;
  FunctionInliningCase *pFVar13;
  string mainValueStatement;
  string expression;
  string maybeFuncDefs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  int local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined4 *local_2c0;
  long local_2b8;
  undefined4 local_2b0;
  undefined1 uStack_2ac;
  undefined2 uStack_2ab;
  undefined1 auStack_2a9 [9];
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280;
  undefined8 local_278;
  long local_270;
  undefined8 uStack_268;
  undefined4 local_25c;
  string local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  FunctionInliningCase *local_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  ProgramData *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_2c0 = &local_2b0;
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    puVar3 = (undefined2 *)auStack_2a9;
    uStack_2ac = 0x75;
    uStack_2ab = 0x706d;
    local_2b0 = 0x6964656d;
    local_2b8 = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      uVar6 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,
                        CONCAT17(auStack_2a9[0],CONCAT25(uStack_2ab,CONCAT14(uStack_2ac,local_2b0)))
                        + 1);
      }
      _Unwind_Resume(uVar6);
    }
    puVar3 = &uStack_2ab;
    uStack_2ac = 0x70;
    local_2b0 = 0x68676968;
    local_2b8 = 5;
  }
  *(undefined1 *)puVar3 = 0;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"value*vec4(0.8, 0.7, 0.6, 0.9)","");
  local_25c = (undefined4)CONCAT71(in_register_00000011,optimized);
  local_1f8 = this;
  local_1b0 = __return_storage_ptr__;
  if (optimized) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,0x1b3c1e9);
  }
  else {
    local_2e4 = this->m_callNestingDepth;
    local_308 = &local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_2c0,local_2b8 + (long)local_2c0);
    std::__cxx11::string::append((char *)&local_308);
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2c0);
    psVar7 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_348.field_2._M_allocated_capacity = *psVar7;
      local_348.field_2._8_8_ = puVar4[3];
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar7;
      local_348._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_348._M_string_length = puVar4[1];
    *puVar4 = psVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_328.field_2._M_allocated_capacity = *psVar7;
      local_328.field_2._8_8_ = plVar5[3];
    }
    else {
      local_328.field_2._M_allocated_capacity = *psVar7;
      local_328._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_328._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_328,(ulong)local_2e0._M_dataplus._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_198 = *plVar8;
      lStack_190 = plVar5[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar8;
      local_1a8 = (long *)*plVar5;
    }
    local_1a0 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_258.field_2._M_allocated_capacity = *psVar7;
      local_258.field_2._8_8_ = plVar5[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar7;
      local_258._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_258._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (1 < local_2e4) {
      iVar12 = 1;
      do {
        local_1f0 = local_1e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,local_2c0,local_2b8 + (long)local_2c0);
        std::__cxx11::string::append((char *)&local_1f0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar11 = local_1e0[0];
        }
        if (uVar11 < (ulong)(local_210 + local_1e8)) {
          uVar11 = 0xf;
          if (local_218 != local_208) {
            uVar11 = local_208[0];
          }
          if (uVar11 < (ulong)(local_210 + local_1e8)) goto LAB_010393e4;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1f0);
        }
        else {
LAB_010393e4:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_218);
        }
        local_280 = &local_270;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_270 = *plVar5;
          uStack_268 = puVar4[3];
        }
        else {
          local_270 = *plVar5;
          local_280 = (long *)*puVar4;
        }
        local_278 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_1d0 = &local_1c0;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_1c0 = *plVar8;
          lStack_1b8 = plVar5[3];
        }
        else {
          local_1c0 = *plVar8;
          local_1d0 = (long *)*plVar5;
        }
        local_1c8 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_2c0);
        local_2a0 = &local_290;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_290 = *plVar8;
          lStack_288 = plVar5[3];
        }
        else {
          local_290 = *plVar8;
          local_2a0 = (long *)*plVar5;
        }
        local_298 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        puVar9 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar9) {
          local_2f8 = *puVar9;
          lStack_2f0 = plVar5[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar9;
          local_308 = (ulong *)*plVar5;
        }
        local_300 = plVar5[1];
        *plVar5 = (long)puVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar12 + -1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_308 != &local_2f8) {
          uVar11 = local_2f8;
        }
        if (uVar11 < (ulong)(local_230 + local_300)) {
          uVar11 = 0xf;
          if (local_238 != local_228) {
            uVar11 = local_228[0];
          }
          if (uVar11 < (ulong)(local_230 + local_300)) goto LAB_01039620;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_01039620:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_238);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        psVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_348.field_2._M_allocated_capacity = *psVar7;
          local_348.field_2._8_8_ = puVar4[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *psVar7;
          local_348._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_348._M_string_length = puVar4[1];
        *puVar4 = psVar7;
        puVar4[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_328.field_2._M_allocated_capacity = *psVar7;
          local_328.field_2._8_8_ = plVar5[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *psVar7;
          local_328._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_328._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if (local_238 != local_228) {
          operator_delete(local_238,local_228[0] + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0,local_1c0 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != local_2e4);
    }
  }
  pFVar13 = local_1f8;
  cVar10 = (char)local_25c;
  if (cVar10 == '\0') {
    iVar12 = local_1f8->m_callNestingDepth;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,iVar12 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x1c2af0d);
    local_308 = &local_2f8;
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_2f8 = *puVar9;
      lStack_2f0 = plVar5[3];
    }
    else {
      local_2f8 = *puVar9;
      local_308 = (ulong *)*plVar5;
    }
    local_300 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_308);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    psVar7 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_348.field_2._M_allocated_capacity = *psVar7;
      local_348.field_2._8_8_ = puVar4[3];
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar7;
      local_348._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_348._M_string_length = puVar4[1];
    *puVar4 = psVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
  }
  else {
    std::operator+(&local_348,"\tvalue = ",&local_2e0);
    pFVar13 = local_1f8;
  }
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_328.field_2._M_allocated_capacity = *psVar7;
    local_328.field_2._8_8_ = plVar5[3];
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  }
  else {
    local_328.field_2._M_allocated_capacity = *psVar7;
    local_328._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_328._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (cVar10 == '\0') {
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,local_290 + 1);
    }
  }
  pPVar2 = local_1b0;
  defaultProgramData(local_1b0,(pFVar13->super_ShaderOptimizationCase).m_caseShaderType,&local_258,
                     &local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,
                    CONCAT17(auStack_2a9[0],CONCAT25(uStack_2ab,CONCAT14(uStack_2ac,local_2b0))) + 1
                   );
  }
  return pPVar2;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string precision				= getShaderPrecision(m_caseShaderType);
		const string expression				= "value*vec4(0.8, 0.7, 0.6, 0.9)";
		const string maybeFuncDefs			= optimized ? "" : funcDefinitions(m_callNestingDepth, precision, expression);
		const string mainValueStatement		= (optimized ? "\tvalue = " + expression : "\tvalue = func" + toString(m_callNestingDepth-1) + "(value)") + ";\n";

		return defaultProgramData(m_caseShaderType, maybeFuncDefs, mainValueStatement);
	}